

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureHandler.cxx
# Opt level: O3

int __thiscall cmCTestConfigureHandler::ProcessHandler(cmCTestConfigureHandler *this)

{
  pointer pcVar1;
  _func_int **pp_Var2;
  cmCTest *pcVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  long lVar8;
  int retVal;
  string cCommand;
  cmXMLWriter xml;
  time_point start_time_time;
  string output;
  string buildDirectory;
  ostringstream cmCTestLog_msg_5;
  string start_time;
  ostringstream cmCTestLog_msg;
  cmGeneratedFileStream ofs;
  int local_744;
  string local_740;
  int local_71c;
  string local_718;
  undefined1 local_6f8 [88];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_6a0;
  string local_698;
  string local_678;
  undefined1 local_658 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648 [6];
  ios_base local_5e8 [264];
  string local_4e0;
  undefined1 local_4c0 [32];
  byte abStack_4a0 [80];
  ios_base local_450 [472];
  undefined1 local_278 [16];
  _func_int *local_268 [2];
  byte abStack_258 [80];
  ios_base local_208 [472];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"Configure project",0x11);
  std::ios::widen((char)(ostringstream *)local_4c0 + (char)*(undefined8 *)(local_4c0._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_4c0);
  std::ostream::flush();
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
               ,0x1a,(char *)local_278._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  if ((_func_int **)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_,(ulong)(local_268[0] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
  std::ios_base::~ios_base(local_450);
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  pcVar1 = local_4c0 + 0x10;
  local_4c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"ConfigureCommand","");
  cmCTest::GetCTestConfiguration(&local_718,pcVar3,(string *)local_4c0);
  if ((pointer)local_4c0._0_8_ != pcVar1) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  if (local_718._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4c0,"Cannot find ConfigureCommand key in the DartConfiguration.tcl",
               0x3d);
    std::ios::widen((char)(ostream *)local_4c0 + (char)*(undefined8 *)(local_4c0._0_8_ + -0x18));
    std::ostream::put((char)local_4c0);
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x20,(char *)local_278._0_8_,false);
    if ((_func_int **)local_278._0_8_ != local_268) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_268[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
    std::ios_base::~ios_base(local_450);
    iVar5 = -1;
    goto LAB_0016a440;
  }
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  local_4c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"BuildDirectory","");
  cmCTest::GetCTestConfiguration(&local_678,pcVar3,(string *)local_4c0);
  if ((pointer)local_4c0._0_8_ != pcVar1) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  if (local_678._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4c0,"Cannot find BuildDirectory  key in the DartConfiguration.tcl",
               0x3c);
    std::ios::widen((char)(ostream *)local_4c0 + (char)*(undefined8 *)(local_4c0._0_8_ + -0x18));
    std::ostream::put((char)local_4c0);
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x29,(char *)local_278._0_8_,false);
    if ((_func_int **)local_278._0_8_ != local_268) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_268[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
    std::ios_base::~ios_base(local_450);
    iVar5 = -1;
  }
  else {
    lVar6 = std::chrono::_V2::steady_clock::now();
    local_698._M_string_length = 0;
    local_698.field_2._M_local_buf[0] = '\0';
    local_744 = 0;
    local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
    bVar4 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
    if (bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4c0,"Configure with command: ",0x18);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_4c0,local_718._M_dataplus._M_p,local_718._M_string_length
                         );
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pcVar3 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                   ,0x5f,(char *)local_278._0_8_,(this->super_cmCTestGenericHandler).Quiet);
      if ((_func_int **)local_278._0_8_ != local_268) {
        operator_delete((void *)local_278._0_8_,(ulong)(local_268[0] + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
      std::ios_base::~ios_base(local_450);
LAB_00169996:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4c0,"Error(s) when configuring the project",0x25);
      std::ios::widen((char)(ostream *)local_4c0 + (char)*(undefined8 *)(local_4c0._0_8_ + -0x18));
      std::ostream::put((char)local_4c0);
      std::ostream::flush();
      pcVar3 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                   ,99,(char *)local_278._0_8_,false);
      if ((_func_int **)local_278._0_8_ != local_268) {
        operator_delete((void *)local_278._0_8_,(ulong)(local_268[0] + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
      std::ios_base::~ios_base(local_450);
      iVar5 = -1;
    }
    else {
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_4c0,None);
      bVar4 = cmCTestGenericHandler::StartResultingXML
                        (&this->super_cmCTestGenericHandler,PartConfigure,"Configure",
                         (cmGeneratedFileStream *)local_4c0);
      if (bVar4) {
        cmCTest::CurrentTime_abi_cxx11_(&local_4e0,(this->super_cmCTestGenericHandler).CTest);
        local_6a0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_278,None);
        cmCTestGenericHandler::StartLogFile
                  (&this->super_cmCTestGenericHandler,"Configure",(cmGeneratedFileStream *)local_278
                  );
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_658,"Configure with command: ",0x18);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_658,local_718._M_dataplus._M_p,
                            local_718._M_string_length);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x3f,(char *)local_6f8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((ostream *)local_6f8._0_8_ != (ostream *)(local_6f8 + 0x10)) {
          operator_delete((void *)local_6f8._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_6f8._16_8_)->_M_p + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
        std::ios_base::~ios_base(local_5e8);
        iVar5 = cmCTest::RunMakeCommand
                          ((this->super_cmCTestGenericHandler).CTest,&local_718,&local_698,
                           &local_744,local_678._M_dataplus._M_p,(cmDuration)0x0,
                           (ostream *)local_278,Auto);
        if ((abStack_258[(long)*(_func_int **)(local_278._0_8_ + -0x18)] & 5) == 0) {
          std::ofstream::close();
        }
        if ((abStack_4a0[*(long *)(local_4c0._0_8_ + -0x18)] & 5) == 0) {
          cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_6f8,(ostream *)local_4c0,0);
          cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_6f8,
                            (this->super_cmCTestGenericHandler).AppendXML);
          cmCTest::GenerateSubprojectsOutput
                    ((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_6f8);
          pp_Var2 = (_func_int **)(local_658 + 0x10);
          local_71c = iVar5;
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"Configure","");
          cmXMLWriter::StartElement((cmXMLWriter *)local_6f8,(string *)local_658);
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"StartDateTime","");
          cmXMLWriter::StartElement((cmXMLWriter *)local_6f8,(string *)local_658);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_6f8,&local_4e0);
          cmXMLWriter::EndElement((cmXMLWriter *)local_6f8);
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_658,"StartConfigureTime","");
          cmXMLWriter::
          Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                    ((cmXMLWriter *)local_6f8,(string *)local_658,&local_6a0);
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"ConfigureCommand","")
          ;
          cmXMLWriter::StartElement((cmXMLWriter *)local_6f8,(string *)local_658);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_6f8,&local_718);
          cmXMLWriter::EndElement((cmXMLWriter *)local_6f8);
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_658,"End",3);
          std::ios::widen((char)(ostream *)local_658 +
                          (char)*(_func_int **)(local_658._0_8_ + -0x18));
          std::ostream::put((char)local_658);
          std::ostream::flush();
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                       ,0x50,local_740._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_740._M_dataplus._M_p != &local_740.field_2) {
            operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
          std::ios_base::~ios_base(local_5e8);
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"Log","");
          cmXMLWriter::StartElement((cmXMLWriter *)local_6f8,(string *)local_658);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_6f8,&local_698);
          cmXMLWriter::EndElement((cmXMLWriter *)local_6f8);
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"ConfigureStatus","");
          cmXMLWriter::Element<int>((cmXMLWriter *)local_6f8,(string *)local_658,&local_744);
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"EndDateTime","");
          cmCTest::CurrentTime_abi_cxx11_(&local_740,(this->super_cmCTestGenericHandler).CTest);
          cmXMLWriter::StartElement((cmXMLWriter *)local_6f8,(string *)local_658);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_6f8,&local_740);
          cmXMLWriter::EndElement((cmXMLWriter *)local_6f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_740._M_dataplus._M_p != &local_740.field_2) {
            operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
          }
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"EndConfigureTime","")
          ;
          local_740._M_dataplus._M_p = (pointer)std::chrono::_V2::system_clock::now();
          cmXMLWriter::
          Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                    ((cmXMLWriter *)local_6f8,(string *)local_658,
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&local_740);
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          local_658._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"ElapsedMinutes","");
          lVar8 = std::chrono::_V2::steady_clock::now();
          local_740._M_dataplus._M_p = (pointer)((lVar8 - lVar6) / 60000000000);
          cmXMLWriter::Element<long>
                    ((cmXMLWriter *)local_6f8,(string *)local_658,(long *)&local_740);
          if ((_func_int **)local_658._0_8_ != pp_Var2) {
            operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
          }
          cmXMLWriter::EndElement((cmXMLWriter *)local_6f8);
          iVar5 = local_71c;
          cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_6f8);
          cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_6f8);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
          operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4c0);
        if ((iVar5 == 0) || (iVar5 = 0, local_744 != 0)) goto LAB_00169996;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"Cannot open configure file",0x1a);
        std::ios::widen((char)(ostream *)local_278 + (char)*(_func_int **)(local_278._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_278);
        std::ostream::flush();
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x35,(char *)local_658._0_8_,false);
        if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
          operator_delete((void *)local_658._0_8_,local_648[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
        std::ios_base::~ios_base(local_208);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4c0);
        iVar5 = 1;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p != &local_698.field_2) {
      operator_delete(local_698._M_dataplus._M_p,
                      CONCAT71(local_698.field_2._M_allocated_capacity._1_7_,
                               local_698.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
LAB_0016a440:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  return iVar5;
}

Assistant:

int cmCTestConfigureHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "Configure project" << std::endl, this->Quiet);
  std::string cCommand =
    this->CTest->GetCTestConfiguration("ConfigureCommand");
  if (cCommand.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find ConfigureCommand key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  std::string buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  auto elapsed_time_start = std::chrono::steady_clock::now();
  std::string output;
  int retVal = 0;
  int res = 0;
  if (!this->CTest->GetShowOnly()) {
    cmGeneratedFileStream os;
    if (!this->StartResultingXML(cmCTest::PartConfigure, "Configure", os)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot open configure file" << std::endl);
      return 1;
    }
    std::string start_time = this->CTest->CurrentTime();
    auto start_time_time = std::chrono::system_clock::now();

    cmGeneratedFileStream ofs;
    this->StartLogFile("Configure", ofs);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Configure with command: " << cCommand << std::endl,
                       this->Quiet);
    res = this->CTest->RunMakeCommand(cCommand, output, &retVal,
                                      buildDirectory.c_str(),
                                      cmDuration::zero(), ofs);

    if (ofs) {
      ofs.close();
    }

    if (os) {
      cmXMLWriter xml(os);
      this->CTest->StartXML(xml, this->AppendXML);
      this->CTest->GenerateSubprojectsOutput(xml);
      xml.StartElement("Configure");
      xml.Element("StartDateTime", start_time);
      xml.Element("StartConfigureTime", start_time_time);
      xml.Element("ConfigureCommand", cCommand);
      cmCTestOptionalLog(this->CTest, DEBUG, "End" << std::endl, this->Quiet);
      xml.Element("Log", output);
      xml.Element("ConfigureStatus", retVal);
      xml.Element("EndDateTime", this->CTest->CurrentTime());
      xml.Element("EndConfigureTime", std::chrono::system_clock::now());
      xml.Element("ElapsedMinutes",
                  std::chrono::duration_cast<std::chrono::minutes>(
                    std::chrono::steady_clock::now() - elapsed_time_start)
                    .count());
      xml.EndElement(); // Configure
      this->CTest->EndXML(xml);
    }
  } else {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Configure with command: " << cCommand << std::endl,
                       this->Quiet);
  }
  if (!res || retVal) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error(s) when configuring the project" << std::endl);
    return -1;
  }
  return 0;
}